

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::
decrement(boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *this)

{
  bool bVar1;
  size_t in_RDI;
  boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *unaff_retaddr;
  size_t next;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x10);
  do {
    if (local_10 == 0) break;
    local_10 = local_10 + -1;
    bVar1 = valid_offset(unaff_retaddr,in_RDI);
  } while (!bVar1);
  update_current(this,next);
  return;
}

Assistant:

void decrement()
                    {
                        size_t next = current_;
                        while(next>0) {
                            next--;
                            if(valid_offset(next))
                                break;
                        }
                        update_current(next);
                    }